

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O3

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,FileDescriptor *file,
                   bool preSpace,bool postNewline)

{
  char cVar1;
  
  cVar1 = *(char *)(*(long *)(descriptor + 0x20) + 0x6a);
  if (file != (FileDescriptor *)0x0 && cVar1 == '\0') {
    cVar1 = *(char *)(*(long *)(file + 0xa0) + 0xa6);
  }
  if (cVar1 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"DEPRECATED_ATTRIBUTE","");
    if (preSpace) {
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x363925);
    }
    if (postNewline) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor,
    const FileDescriptor* file = NULL,
    bool preSpace = true, bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  if (!isDeprecated && file) {
    isDeprecated = file->options().deprecated();
  }
  if (isDeprecated) {
    string result = "DEPRECATED_ATTRIBUTE";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}